

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O3

void __thiscall
mahjong::PatternComputer::setHighest
          (PatternComputer *this,WiningHand *hand,WiningPatterns *patterns)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  long lVar5;
  WiningPatterns *__range1;
  Pattern it;
  WiningPatterns final_patterns;
  IsLimitHand local_75;
  _Rb_tree_color local_74;
  WiningHand *local_70;
  PatternComputer *local_68;
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (patterns->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(patterns->_M_t)._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
LAB_00197b7e:
    std::
    _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
    ::operator=(&local_60,&patterns->_M_t);
  }
  else {
    local_70 = hand;
    local_68 = this;
    do {
      local_74 = p_Var4[1]._M_color;
      bVar3 = IsLimitHand::operator()(&local_75,&local_74);
      if (bVar3) {
        std::
        _Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
        ::_M_insert_unique<mahjong::Pattern_const&>
                  ((_Rb_tree<mahjong::Pattern,mahjong::Pattern,std::_Identity<mahjong::Pattern>,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>
                    *)&local_60,&local_74);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    this = local_68;
    hand = local_70;
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) goto LAB_00197b7e;
  }
  if ((this->highest_patterns)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    lVar5 = std::_Rb_tree_decrement
                      (&(this->highest_patterns)._M_t._M_impl.super__Rb_tree_header._M_header);
    iVar2 = *(int *)(lVar5 + 0x20);
    lVar5 = std::_Rb_tree_decrement(&local_60._M_impl.super__Rb_tree_header._M_header);
    if (*(int *)(lVar5 + 0x20) <= iVar2) goto LAB_00197bed;
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::operator=(&(this->highest_patterns)._M_t,&local_60);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::operator=
            (&(this->highest_wining_hand).pairs,&hand->pairs);
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::operator=
            (&(this->highest_wining_hand).melds,&hand->melds);
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::operator=
            (&(this->highest_wining_hand).tiles,&hand->tiles);
  (this->highest_wining_hand).last_tile = hand->last_tile;
LAB_00197bed:
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void PatternComputer::setHighest(const WiningHand& hand, const WiningPatterns& patterns)
{
	// limit hands can combine only themselves.
	WiningPatterns final_patterns;
	for (auto it : patterns)
	{
		if (IsLimitHand()(it))
		{
			final_patterns.insert(it);
		}
	}
	if (final_patterns.empty())
	{
		final_patterns = patterns;
	}

	// choose highest
	if (highest_patterns.empty())
	{
		highest_patterns = final_patterns;
		highest_wining_hand = hand;
	}
	else if ((int)*highest_patterns.rbegin() < (int)*final_patterns.rbegin())
	{
		highest_patterns = final_patterns;
		highest_wining_hand = hand;
	}
}